

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcStatesPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  long lVar9;
  double *pdVar10;
  int iVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  double *pdVar19;
  double *pdVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int local_c0;
  double *local_b0;
  double *local_a8;
  
  uVar2 = this->kStateCount;
  uVar3 = this->kCategoryCount;
  iVar4 = this->kPatternCount;
  iVar5 = this->kPartialsPaddedStateCount;
  iVar6 = this->kMatrixSize;
  local_c0 = 0;
  lVar22 = (long)(int)(uVar2 + 1);
  local_b0 = matrices2 + 2;
  iVar11 = startPattern * iVar5;
  local_a8 = matrices2;
  for (uVar16 = 0; uVar16 != (~((int)uVar3 >> 0x1f) & uVar3); uVar16 = uVar16 + 1) {
    pdVar15 = partials2 + iVar11;
    pdVar12 = destP + (iVar4 * (int)uVar16 + startPattern) * iVar5;
    for (lVar18 = (long)startPattern; lVar18 < endPattern; lVar18 = lVar18 + 1) {
      iVar7 = states1[lVar18];
      pdVar10 = local_a8;
      lVar13 = (long)local_c0;
      pdVar20 = local_b0;
      for (uVar21 = 0; uVar21 != (~((int)uVar2 >> 0x1f) & uVar2); uVar21 = uVar21 + 1) {
        lVar9 = iVar7 + lVar13;
        auVar23 = ZEXT816(0) << 0x40;
        pdVar17 = pdVar15;
        pdVar19 = pdVar10;
        for (lVar14 = 0; auVar8 = auVar23, lVar14 < (int)uVar2 / 4 << 2; lVar14 = lVar14 + 4) {
          pdVar17 = pdVar17 + 4;
          pdVar19 = pdVar19 + 4;
          auVar23 = vfmadd231pd_fma(auVar23,*(undefined1 (*) [16])(pdVar20 + lVar14 + -2),
                                    *(undefined1 (*) [16])(pdVar15 + lVar14));
          auVar23 = vfmadd231pd_fma(auVar23,*(undefined1 (*) [16])(pdVar20 + lVar14),
                                    *(undefined1 (*) [16])(pdVar15 + lVar14 + 2));
        }
        while (lVar14 < (int)uVar2) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *pdVar19;
          lVar14 = lVar14 + 1;
          pdVar19 = pdVar19 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *pdVar17;
          auVar8 = vfmadd231sd_fma(auVar8,auVar24,auVar1);
          pdVar17 = pdVar17 + 1;
        }
        auVar23 = vshufpd_avx(auVar23,auVar23,1);
        lVar13 = lVar13 + lVar22;
        pdVar20 = pdVar20 + lVar22;
        pdVar10 = pdVar10 + lVar22;
        *pdVar12 = matrices1[lVar9] * (auVar23._0_8_ + auVar8._0_8_);
        pdVar12 = pdVar12 + 1;
      }
      pdVar15 = pdVar15 + iVar5;
    }
    local_c0 = local_c0 + iVar6;
    iVar11 = iVar11 + iVar4 * iVar5;
    local_b0 = local_b0 + iVar6;
    local_a8 = local_a8 + iVar6;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                           const int* states1,
                                                           const REALTYPE* matrices1,
                                                           const REALTYPE* partials2,
                                                           const REALTYPE* matrices2,
                                                           int startPattern,
                                                           int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;


    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB);
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}